

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

PixOrCopyBlock * BackwardRefsNewBlock(VP8LBackwardRefs *refs)

{
  PixOrCopyBlock *pPVar1;
  int *in_RDI;
  size_t total_size;
  PixOrCopyBlock *b;
  
  pPVar1 = *(PixOrCopyBlock **)(in_RDI + 6);
  if (pPVar1 == (PixOrCopyBlock *)0x0) {
    pPVar1 = (PixOrCopyBlock *)WebPSafeMalloc(0,(long)*in_RDI * 8 + 0x18);
    if (pPVar1 == (PixOrCopyBlock *)0x0) {
      in_RDI[1] = in_RDI[1] | 1;
      return (PixOrCopyBlock *)0x0;
    }
    pPVar1->start_ = (PixOrCopy *)(pPVar1 + 1);
  }
  else {
    *(PixOrCopyBlock **)(in_RDI + 6) = pPVar1->next_;
  }
  **(undefined8 **)(in_RDI + 4) = pPVar1;
  *(PixOrCopyBlock **)(in_RDI + 4) = pPVar1;
  *(PixOrCopyBlock **)(in_RDI + 8) = pPVar1;
  pPVar1->next_ = (PixOrCopyBlock *)0x0;
  pPVar1->size_ = 0;
  return pPVar1;
}

Assistant:

static PixOrCopyBlock* BackwardRefsNewBlock(VP8LBackwardRefs* const refs) {
  PixOrCopyBlock* b = refs->free_blocks_;
  if (b == NULL) {   // allocate new memory chunk
    const size_t total_size =
        sizeof(*b) + refs->block_size_ * sizeof(*b->start_);
    b = (PixOrCopyBlock*)WebPSafeMalloc(1ULL, total_size);
    if (b == NULL) {
      refs->error_ |= 1;
      return NULL;
    }
    b->start_ = (PixOrCopy*)((uint8_t*)b + sizeof(*b));  // not always aligned
  } else {  // recycle from free-list
    refs->free_blocks_ = b->next_;
  }
  *refs->tail_ = b;
  refs->tail_ = &b->next_;
  refs->last_block_ = b;
  b->next_ = NULL;
  b->size_ = 0;
  return b;
}